

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSendSession.cpp
# Opt level: O0

void __thiscall FileSendSession::~FileSendSession(FileSendSession *this)

{
  FileSendSession *this_local;
  
  ~FileSendSession(this);
  operator_delete(this,0x2d0);
  return;
}

Assistant:

FileSendSession::~FileSendSession() {
  if (stream.is_open())
    stream.close();
}